

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O1

void transproc(quadtype nextquad)

{
  char target [10];
  char label [10];
  char local_24 [10];
  char local_1a [10];
  
  getlabel(label._2_4_,local_24);
  fwrite("; call ",7,1,(FILE *)ofp);
  fprintlexeme(ofp,label._2_4_);
  fputc(10,(FILE *)ofp);
  getlabel(label._2_4_,local_1a);
  fprintf((FILE *)ofp,"         %-10s  %s\n",opcodestr[0x11],local_1a);
  fputc(10,(FILE *)ofp);
  return;
}

Assistant:

void    transproc(struct quadtype nextquad)
{
    char    target[LABELSIZE];
    
    getlabel(nextquad.op1.opnd, target);
    fprintf(ofp, "; call ");
    fprintlexeme(ofp, nextquad.op1.opnd);
    fprintf(ofp, "\n");
    emitone(opccall, nextquad.op1.opnd);
    fprintf(ofp, "\n");
}